

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout_p.h
# Opt level: O3

QList<int> * __thiscall
QMainWindowLayoutSeparatorHelper<QMainWindowLayout>::findSeparator
          (QList<int> *__return_storage_ptr__,
          QMainWindowLayoutSeparatorHelper<QMainWindowLayout> *this,QPoint *pos)

{
  qsizetype qVar1;
  bool bVar2;
  QWidget *this_00;
  QWidget *pQVar3;
  QWidget *toolBar;
  long in_FS_OFFSET;
  QList<int> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = QToolBarAreaLayout::isEmpty((QToolBarAreaLayout *)&this[1].hoverPos);
  if (!bVar2) {
    this_00 = QLayout::parentWidget((QLayout *)&this[-1].movingSeparator.d.size);
    pQVar3 = QWidget::childAt(this_00,pos);
    if (pQVar3 != this_00 && pQVar3 != (QWidget *)0x0) {
      do {
        toolBar = (QWidget *)QMetaObject::cast((QObject *)&QToolBar::staticMetaObject);
        if (toolBar != (QWidget *)0x0) {
          QToolBarAreaLayout::indexOf(&local_50,(QToolBarAreaLayout *)&this[1].hoverPos,toolBar);
          qVar1 = local_50.d.size;
          if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,4,0x10);
            }
          }
          if (qVar1 != 0) {
            (__return_storage_ptr__->d).d = (Data *)0x0;
            (__return_storage_ptr__->d).ptr = (int *)0x0;
            (__return_storage_ptr__->d).size = 0;
            goto LAB_0042cacc;
          }
        }
        pQVar3 = *(QWidget **)(*(long *)&pQVar3->field_0x8 + 0x10);
      } while ((pQVar3 != (QWidget *)0x0) && (pQVar3 != this_00));
    }
  }
  QDockAreaLayout::findSeparator
            (__return_storage_ptr__,(QDockAreaLayout *)&this[3].movingSeparator.d.size,pos);
LAB_0042cacc:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QList<int> QMainWindowLayoutSeparatorHelper<Layout>::findSeparator(const QPoint &pos) const
{
    Layout *layout = const_cast<Layout*>(this->layout());
#if QT_CONFIG(toolbar)
    QToolBarAreaLayout *toolBarAreaLayout = layout->toolBarAreaLayout();
    if (toolBarAreaLayout && !toolBarAreaLayout->isEmpty()) {
        // We might have a toolbar that is currently expanded, covering
        // parts of the dock area, in which case we don't want the dock
        // area layout to treat mouse events for the expanded toolbar as
        // hitting a separator.
        const QWidget *widget = layout->window();
        QWidget *childWidget = widget->childAt(pos);
        while (childWidget && childWidget != widget) {
            if (auto *toolBar = qobject_cast<QToolBar*>(childWidget)) {
                if (!toolBarAreaLayout->indexOf(toolBar).isEmpty())
                    return {};
            }
            childWidget = childWidget->parentWidget();
        }
    }
#endif
    return layout->dockAreaLayoutInfo()->findSeparator(pos);
}